

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O0

void __thiscall RhombicLattice::createFaces(RhombicLattice *this)

{
  long in_RDI;
  double dVar1;
  double dVar2;
  cartesian4 coordinate;
  int vertexIndex;
  int faceIndex;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffc150;
  int in_stack_ffffffffffffc15c;
  Lattice *in_stack_ffffffffffffc160;
  allocator_type *in_stack_ffffffffffffc168;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffc170;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffc178;
  string *local_3dc8;
  string *local_3d58;
  string *local_3ce8;
  allocator *in_stack_ffffffffffffc338;
  string *in_stack_ffffffffffffc340;
  allocator *in_stack_ffffffffffffc348;
  Lattice *in_stack_ffffffffffffc350;
  string *local_3c78;
  string *local_3c08;
  string *local_3b98;
  string *local_3a38;
  string *local_39c8;
  string *local_3958;
  string *local_38e8;
  string *local_3878;
  string *local_3808;
  string *local_3720;
  string *local_36b0;
  string *local_3640;
  string *local_35a8;
  string *local_34c0;
  string *local_3450;
  string *local_33e0;
  string *local_3348;
  string *local_3288;
  string *local_3218;
  string *local_3158;
  string *local_30e8;
  string *local_3028;
  string *local_2fb8;
  string *local_2ef8;
  string *local_2e88;
  string *local_2dc8;
  string *local_2d58;
  string *local_2c98;
  string *local_2c28;
  string *local_2b90;
  string *local_2af8;
  string *local_2a38;
  string *local_29c8;
  string *local_2930;
  string *local_2870;
  string *local_2800;
  string *local_2768;
  undefined4 local_26f0;
  undefined4 local_26ec;
  undefined4 local_26e8;
  undefined4 local_26e4;
  undefined4 *local_26e0;
  undefined8 local_26d8;
  undefined1 local_26b5;
  allocator local_26b4;
  allocator local_26b3;
  allocator local_26b2;
  allocator local_26b1;
  string *local_26b0;
  string local_26a8 [32];
  string local_2688 [32];
  string local_2668 [32];
  string local_2648 [32];
  string *local_2628;
  undefined8 local_2620;
  undefined4 local_25f8;
  undefined4 local_25f4;
  undefined4 local_25f0;
  undefined4 local_25ec;
  undefined4 *local_25e8;
  undefined8 local_25e0;
  undefined1 local_25bd;
  allocator local_25bc;
  allocator local_25bb;
  allocator local_25ba;
  allocator local_25b9;
  string *local_25b8;
  string local_25b0 [32];
  string local_2590 [32];
  string local_2570 [32];
  string local_2550 [32];
  string *local_2530;
  undefined8 local_2528;
  undefined4 local_2500;
  undefined4 local_24fc;
  undefined4 local_24f8;
  undefined4 local_24f4;
  undefined4 *local_24f0;
  undefined8 local_24e8;
  undefined1 local_24c5;
  allocator local_24c4;
  allocator local_24c3;
  allocator local_24c2;
  allocator local_24c1;
  Lattice *local_24c0;
  string local_24b8 [32];
  undefined1 local_2498 [64];
  string local_2458 [32];
  string *local_2438;
  _Base_ptr local_2430;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined4 local_2400;
  undefined4 local_23fc;
  undefined4 *local_23f8;
  undefined8 local_23f0;
  undefined1 local_23cd;
  allocator local_23cc;
  allocator local_23cb;
  allocator local_23ca;
  allocator local_23c9;
  string *local_23c8;
  string local_23c0 [32];
  string local_23a0 [32];
  string local_2380 [32];
  string local_2360 [32];
  string *local_2340;
  undefined8 local_2338;
  undefined4 local_2310;
  undefined4 local_230c;
  undefined4 local_2308;
  undefined4 local_2304;
  undefined4 *local_2300;
  undefined8 local_22f8;
  undefined1 local_22d5;
  allocator local_22d4;
  allocator local_22d3;
  allocator local_22d2;
  allocator local_22d1;
  string *local_22d0;
  string local_22c8 [32];
  string local_22a8 [32];
  string local_2288 [32];
  string local_2268 [32];
  string *local_2248;
  undefined8 local_2240;
  undefined4 local_2218;
  undefined4 local_2214;
  undefined4 local_2210;
  undefined4 local_220c;
  undefined4 *local_2208;
  undefined8 local_2200;
  undefined1 local_21dd;
  allocator local_21dc;
  allocator local_21db;
  allocator local_21da;
  allocator local_21d9;
  string *local_21d8;
  string local_21d0 [32];
  string local_21b0 [32];
  string local_2190 [32];
  string local_2170 [32];
  string *local_2150;
  undefined8 local_2148;
  undefined4 local_2120;
  undefined4 local_211c;
  undefined4 local_2118;
  undefined4 local_2114;
  undefined4 *local_2110;
  undefined8 local_2108;
  undefined1 local_20e5;
  allocator local_20e4;
  allocator local_20e3;
  allocator local_20e2;
  allocator local_20e1;
  string *local_20e0;
  string local_20d8 [32];
  string local_20b8 [32];
  string local_2098 [32];
  string local_2078 [32];
  string *local_2058;
  undefined8 local_2050;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined4 local_2020;
  undefined4 local_201c;
  undefined4 *local_2018;
  undefined8 local_2010;
  undefined1 local_1fed;
  allocator local_1fec;
  allocator local_1feb;
  allocator local_1fea;
  allocator local_1fe9;
  string *local_1fe8;
  string local_1fe0 [32];
  string local_1fc0 [32];
  string local_1fa0 [32];
  string local_1f80 [32];
  string *local_1f60;
  undefined8 local_1f58;
  undefined4 local_1f30;
  undefined4 local_1f2c;
  undefined4 local_1f28;
  undefined4 local_1f24;
  undefined4 *local_1f20;
  undefined8 local_1f18;
  undefined1 local_1ef5;
  allocator local_1ef4;
  allocator local_1ef3;
  allocator local_1ef2;
  allocator local_1ef1;
  string *local_1ef0;
  string local_1ee8 [32];
  string local_1ec8 [32];
  string local_1ea8 [32];
  string local_1e88 [32];
  string *local_1e68;
  undefined8 local_1e60;
  undefined4 local_1e38;
  undefined4 local_1e34;
  undefined4 local_1e30;
  undefined4 local_1e2c;
  undefined4 *local_1e28;
  undefined8 local_1e20;
  undefined1 local_1dfd;
  allocator local_1dfc;
  allocator local_1dfb;
  allocator local_1dfa;
  allocator local_1df9;
  string *local_1df8;
  string local_1df0 [32];
  string local_1dd0 [32];
  string local_1db0 [32];
  string local_1d90 [32];
  string *local_1d70;
  undefined8 local_1d68;
  undefined4 local_1d40;
  undefined4 local_1d3c;
  undefined4 local_1d38;
  undefined4 local_1d34;
  undefined4 *local_1d30;
  undefined8 local_1d28;
  undefined1 local_1d05;
  allocator local_1d04;
  allocator local_1d03;
  allocator local_1d02;
  allocator local_1d01;
  string *local_1d00;
  string local_1cf8 [32];
  string local_1cd8 [32];
  string local_1cb8 [32];
  string local_1c98 [32];
  string *local_1c78;
  undefined8 local_1c70;
  undefined4 local_1c48;
  undefined4 local_1c44;
  undefined4 local_1c40;
  undefined4 local_1c3c;
  undefined4 *local_1c38;
  undefined8 local_1c30;
  undefined1 local_1c0d;
  allocator local_1c0c;
  allocator local_1c0b;
  allocator local_1c0a;
  allocator local_1c09;
  string *local_1c08;
  string local_1c00 [32];
  string local_1be0 [32];
  string local_1bc0 [32];
  string local_1ba0 [32];
  string *local_1b80;
  undefined8 local_1b78;
  undefined4 local_1b50;
  undefined4 local_1b4c;
  undefined4 local_1b48;
  undefined4 local_1b44;
  undefined4 *local_1b40;
  undefined8 local_1b38;
  undefined1 local_1b15;
  allocator local_1b14;
  allocator local_1b13;
  allocator local_1b12;
  allocator local_1b11;
  string *local_1b10;
  string local_1b08 [32];
  string local_1ae8 [32];
  string local_1ac8 [32];
  string local_1aa8 [32];
  string *local_1a88;
  undefined8 local_1a80;
  undefined4 local_1a58;
  undefined4 local_1a54;
  undefined4 local_1a50;
  undefined4 local_1a4c;
  undefined4 *local_1a48;
  undefined8 local_1a40;
  undefined1 local_1a1d;
  allocator local_1a1c;
  allocator local_1a1b;
  allocator local_1a1a;
  allocator local_1a19;
  string *local_1a18;
  string local_1a10 [32];
  string local_19f0 [32];
  string local_19d0 [32];
  string local_19b0 [32];
  string *local_1990;
  undefined8 local_1988;
  undefined4 local_1960;
  undefined4 local_195c;
  undefined4 local_1958;
  undefined4 local_1954;
  undefined4 *local_1950;
  undefined8 local_1948;
  undefined1 local_1925;
  allocator local_1924;
  allocator local_1923;
  allocator local_1922;
  allocator local_1921;
  string *local_1920;
  string local_1918 [32];
  string local_18f8 [32];
  string local_18d8 [32];
  string local_18b8 [32];
  string *local_1898;
  undefined8 local_1890;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined4 local_1860;
  undefined4 local_185c;
  undefined4 *local_1858;
  undefined8 local_1850;
  undefined1 local_182d;
  allocator local_182c;
  allocator local_182b;
  allocator local_182a;
  allocator local_1829;
  string *local_1828;
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string *local_17a0;
  undefined8 local_1798;
  undefined4 local_1770;
  undefined4 local_176c;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined4 *local_1760;
  undefined8 local_1758;
  undefined1 local_1735;
  allocator local_1734;
  allocator local_1733;
  allocator local_1732;
  allocator local_1731;
  string *local_1730;
  string local_1728 [32];
  string local_1708 [32];
  string local_16e8 [32];
  string local_16c8 [32];
  string *local_16a8;
  undefined8 local_16a0;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 *local_1668;
  undefined8 local_1660;
  undefined1 local_163d;
  allocator local_163c;
  allocator local_163b;
  allocator local_163a;
  allocator local_1639;
  string *local_1638;
  string local_1630 [32];
  string local_1610 [32];
  string local_15f0 [32];
  string local_15d0 [32];
  string *local_15b0;
  undefined8 local_15a8;
  undefined4 local_1580;
  undefined4 local_157c;
  undefined4 local_1578;
  undefined4 local_1574;
  undefined4 *local_1570;
  undefined8 local_1568;
  undefined1 local_1545;
  allocator local_1544;
  allocator local_1543;
  allocator local_1542;
  allocator local_1541;
  string *local_1540;
  string local_1538 [32];
  string local_1518 [32];
  string local_14f8 [32];
  string local_14d8 [32];
  string *local_14b8;
  undefined8 local_14b0;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 *local_1478;
  undefined8 local_1470;
  undefined1 local_144d;
  allocator local_144c;
  allocator local_144b;
  allocator local_144a;
  allocator local_1449;
  string *local_1448;
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string *local_13c0;
  undefined8 local_13b8;
  undefined4 local_1390;
  undefined4 local_138c;
  undefined4 local_1388;
  undefined4 local_1384;
  undefined4 *local_1380;
  undefined8 local_1378;
  undefined1 local_1355;
  allocator local_1354;
  allocator local_1353;
  allocator local_1352;
  allocator local_1351;
  string *local_1350;
  string local_1348 [32];
  string local_1328 [32];
  string local_1308 [32];
  string local_12e8 [32];
  string *local_12c8;
  undefined8 local_12c0;
  undefined4 local_1298;
  undefined4 local_1294;
  undefined4 local_1290;
  undefined4 local_128c;
  undefined4 *local_1288;
  undefined8 local_1280;
  undefined1 local_125d;
  allocator local_125c;
  allocator local_125b;
  allocator local_125a;
  allocator local_1259;
  string *local_1258;
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  string *local_11d0;
  undefined8 local_11c8;
  undefined4 local_11a0;
  undefined4 local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  undefined4 *local_1190;
  undefined8 local_1188;
  undefined1 local_1165;
  allocator local_1164;
  allocator local_1163;
  allocator local_1162;
  allocator local_1161;
  string *local_1160;
  string local_1158 [32];
  string local_1138 [32];
  string local_1118 [32];
  string local_10f8 [32];
  string *local_10d8;
  undefined8 local_10d0;
  undefined4 local_10a8;
  undefined4 local_10a4;
  undefined4 local_10a0;
  undefined4 local_109c;
  undefined4 *local_1098;
  undefined8 local_1090;
  undefined1 local_106d;
  allocator local_106c;
  allocator local_106b;
  allocator local_106a;
  allocator local_1069;
  string *local_1068;
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string *local_fe0;
  undefined8 local_fd8;
  undefined4 local_fb0;
  undefined4 local_fac;
  undefined4 local_fa8;
  undefined4 local_fa4;
  undefined4 *local_fa0;
  undefined8 local_f98;
  undefined1 local_f75;
  allocator local_f74;
  allocator local_f73;
  allocator local_f72;
  allocator local_f71;
  string *local_f70;
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  string *local_ee8;
  undefined8 local_ee0;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  undefined4 local_eac;
  undefined4 *local_ea8;
  undefined8 local_ea0;
  undefined1 local_e7d;
  allocator local_e7c;
  allocator local_e7b;
  allocator local_e7a;
  allocator local_e79;
  string *local_e78;
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string *local_df0;
  undefined8 local_de8;
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 *local_db0;
  undefined8 local_da8;
  undefined1 local_d85;
  allocator local_d84;
  allocator local_d83;
  allocator local_d82;
  allocator local_d81;
  string *local_d80;
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string *local_cf8;
  undefined8 local_cf0;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined4 *local_cb8;
  undefined8 local_cb0;
  undefined1 local_c8d;
  allocator local_c8c;
  allocator local_c8b;
  allocator local_c8a;
  allocator local_c89;
  string *local_c88;
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string *local_c00;
  undefined8 local_bf8;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 *local_bc0;
  undefined8 local_bb8;
  undefined1 local_b95;
  allocator local_b94;
  allocator local_b93;
  allocator local_b92;
  allocator local_b91;
  string *local_b90;
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  string local_b28 [32];
  string *local_b08;
  undefined8 local_b00;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 *local_ac8;
  undefined8 local_ac0;
  undefined1 local_a9d;
  allocator local_a9c;
  allocator local_a9b;
  allocator local_a9a;
  allocator local_a99;
  string *local_a98;
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string *local_a10;
  undefined8 local_a08;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 *local_9d0;
  undefined8 local_9c8;
  undefined1 local_9a5;
  allocator local_9a4;
  allocator local_9a3;
  allocator local_9a2;
  allocator local_9a1;
  string *local_9a0;
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string *local_918;
  undefined8 local_910;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 *local_8d8;
  undefined8 local_8d0;
  undefined1 local_8ad;
  allocator local_8ac;
  allocator local_8ab;
  allocator local_8aa;
  allocator local_8a9;
  string *local_8a8;
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string *local_820;
  undefined8 local_818;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 *local_7e0;
  undefined8 local_7d8;
  undefined1 local_7b5;
  allocator local_7b4;
  allocator local_7b3;
  allocator local_7b2;
  allocator local_7b1;
  string *local_7b0;
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string *local_728;
  undefined8 local_720;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 *local_6e8;
  undefined8 local_6e0;
  undefined1 local_6bd;
  allocator local_6bc;
  allocator local_6bb;
  allocator local_6ba;
  allocator local_6b9;
  string *local_6b8;
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string *local_630;
  undefined8 local_628;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 *local_5f0;
  undefined8 local_5e8;
  undefined1 local_5c5;
  allocator local_5c4;
  allocator local_5c3;
  allocator local_5c2;
  allocator local_5c1;
  string *local_5c0;
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string *local_538;
  undefined8 local_530;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 *local_4f8;
  undefined8 local_4f0;
  undefined1 local_4cd;
  allocator local_4cc;
  allocator local_4cb;
  allocator local_4ca;
  allocator local_4c9;
  string *local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string *local_440;
  undefined8 local_438;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined4 *local_400;
  undefined8 local_3f8;
  undefined1 local_3d5;
  allocator local_3d4;
  allocator local_3d3;
  allocator local_3d2;
  allocator local_3d1;
  string *local_3d0;
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string *local_348;
  undefined8 local_340;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 *local_308;
  undefined8 local_300;
  undefined1 local_2dd;
  allocator local_2dc;
  allocator local_2db;
  allocator local_2da;
  allocator local_2d9;
  string *local_2d8;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string *local_250;
  undefined8 local_248;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 *local_210;
  undefined8 local_208;
  undefined1 local_1e5;
  allocator local_1e4;
  allocator local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  string *local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string *local_158;
  undefined8 local_150;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 *local_118;
  undefined8 local_110;
  undefined1 local_e8;
  allocator local_e7;
  allocator local_e6;
  allocator local_e5 [20];
  allocator local_d1;
  string *local_d0;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string *local_48;
  undefined8 local_40;
  cartesian4 local_20;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; dVar1 = (double)local_10, dVar2 = pow((double)*(int *)(in_RDI + 8),3.0),
      dVar1 < dVar2; local_10 = local_10 + 1) {
    local_20 = Lattice::indexToCoordinate(in_stack_ffffffffffffc160,in_stack_ffffffffffffc15c);
    if (((local_20.x + local_20.y + local_20.z) % 2 == 1) && (local_20.z != 0)) {
      if (local_20.z % 2 == 1) {
        if (local_20.y == 0) {
          local_e8 = 1;
          local_d0 = local_c8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"xyz",&local_d1);
          local_d0 = local_a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"xy",local_e5);
          local_d0 = local_88;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_88,"xy",&local_e6);
          local_d0 = local_68;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_68,"xyz",&local_e7);
          local_e8 = 0;
          local_48 = local_c8;
          local_40 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x16dbcc);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_128 = 1;
          local_124 = 1;
          local_120 = 1;
          local_11c = 1;
          local_118 = &local_128;
          local_110 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x16dc50);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x16dcbe);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16dcd8);
          local_2768 = (string *)&local_48;
          do {
            local_2768 = local_2768 + -0x20;
            std::__cxx11::string::~string(local_2768);
          } while (local_2768 != local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e7);
          std::allocator<char>::~allocator((allocator<char> *)&local_e6);
          std::allocator<char>::~allocator((allocator<char> *)local_e5);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          local_c = local_c + 1;
        }
        else if (local_20.x == 0) {
          local_1e5 = 1;
          local_1e0 = local_1d8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d8,"xyz",&local_1e1);
          local_1e0 = local_1b8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b8,"xy",&local_1e2);
          local_1e0 = local_198;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_198,"xy",&local_1e3);
          local_1e0 = local_178;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_178,"xyz",&local_1e4);
          local_1e5 = 0;
          local_158 = local_1d8;
          local_150 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x16e0d5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_220 = 1;
          local_21c = 1;
          local_218 = 1;
          local_214 = 1;
          local_210 = &local_220;
          local_208 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x16e159);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x16e1c7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x16e1e1);
          local_2800 = (string *)&local_158;
          do {
            local_2800 = local_2800 + -0x20;
            std::__cxx11::string::~string(local_2800);
          } while (local_2800 != local_1d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e4);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e3);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e2);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
          local_c = local_c + 1;
          if (local_20.z != *(int *)(in_RDI + 8) + -1) {
            local_2dd = 1;
            local_2d8 = local_2d0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2d0,"xyz",&local_2d9);
            local_2d8 = local_2b0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2b0,"xz",&local_2da);
            local_2d8 = local_290;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_290,"xz",&local_2db);
            local_2d8 = local_270;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,"xyz",&local_2dc);
            local_2dd = 0;
            local_250 = local_2d0;
            local_248 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x16e420);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_318 = 1;
            local_314 = 1;
            local_310 = 1;
            local_30c = 1;
            local_308 = &local_318;
            local_300 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x16e4a4);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x16e512);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x16e52c);
            local_2870 = (string *)&local_250;
            do {
              local_2870 = local_2870 + -0x20;
              std::__cxx11::string::~string(local_2870);
            } while (local_2870 != local_2d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2dc);
            std::allocator<char>::~allocator((allocator<char> *)&local_2db);
            std::allocator<char>::~allocator((allocator<char> *)&local_2da);
            std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
            local_c = local_c + 1;
          }
          if (local_20.z != 1) {
            local_3d5 = 1;
            local_3d0 = local_3c8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3c8,"xy",&local_3d1);
            local_3d0 = local_3a8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3a8,"yz",&local_3d2);
            local_3d0 = local_388;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_388,"yz",&local_3d3);
            local_3d0 = local_368;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_368,"xy",&local_3d4);
            local_3d5 = 0;
            local_348 = local_3c8;
            local_340 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x16eaf1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_410 = 1;
            local_40c = 0xffffffff;
            local_408 = 0xffffffff;
            local_404 = 1;
            local_400 = &local_410;
            local_3f8 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x16eb75);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x16ebe3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x16ebfd);
            local_2930 = (string *)&local_348;
            do {
              local_2930 = local_2930 + -0x20;
              std::__cxx11::string::~string(local_2930);
            } while (local_2930 != local_3c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d4);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d3);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d2);
            std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
            local_c = local_c + 1;
          }
        }
        else if (local_20.x == *(int *)(in_RDI + 8) + -1) {
          if (local_20.y != *(int *)(in_RDI + 8) + -1) {
            local_4cd = 1;
            local_4c8 = local_4c0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4c0,"yz",&local_4c9);
            local_4c8 = local_4a0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4a0,"xz",&local_4ca);
            local_4c8 = local_480;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_480,"xz",&local_4cb);
            local_4c8 = local_460;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_460,"yz",&local_4cc);
            local_4cd = 0;
            local_440 = local_4c0;
            local_438 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x16f02c);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_508 = 1;
            local_504 = 0xffffffff;
            local_500 = 0xffffffff;
            local_4fc = 1;
            local_4f8 = &local_508;
            local_4f0 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x16f0b0);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x16f11e);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x16f138);
            local_29c8 = (string *)&local_440;
            do {
              local_29c8 = local_29c8 + -0x20;
              std::__cxx11::string::~string(local_29c8);
            } while (local_29c8 != local_4c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4cc);
            std::allocator<char>::~allocator((allocator<char> *)&local_4cb);
            std::allocator<char>::~allocator((allocator<char> *)&local_4ca);
            std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
            local_c = local_c + 1;
            if (local_20.z != *(int *)(in_RDI + 8) + -1) {
              local_5c5 = 1;
              local_5c0 = local_5b8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_5b8,"xy",&local_5c1);
              local_5c0 = local_598;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_598,"yz",&local_5c2);
              local_5c0 = local_578;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_578,"yz",&local_5c3);
              local_5c0 = local_558;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_558,"xy",&local_5c4);
              local_5c5 = 0;
              local_538 = local_5b8;
              local_530 = 4;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x16f377);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                       in_stack_ffffffffffffc168);
              local_600 = 0xffffffff;
              local_5fc = 1;
              local_5f8 = 1;
              local_5f4 = 0xffffffff;
              local_5f0 = &local_600;
              local_5e8 = 4;
              std::allocator<int>::allocator((allocator<int> *)0x16f3fb);
              std::vector<int,_std::allocator<int>_>::vector
                        (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                         (allocator_type *)in_stack_ffffffffffffc168);
              Lattice::addFace(in_stack_ffffffffffffc350,
                               (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                               (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                               (vint *)in_stack_ffffffffffffc338);
              std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
              std::allocator<int>::~allocator((allocator<int> *)0x16f469);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffc150);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x16f483);
              local_2a38 = (string *)&local_538;
              do {
                local_2a38 = local_2a38 + -0x20;
                std::__cxx11::string::~string(local_2a38);
              } while (local_2a38 != local_5b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_5c4);
              std::allocator<char>::~allocator((allocator<char> *)&local_5c3);
              std::allocator<char>::~allocator((allocator<char> *)&local_5c2);
              std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
              local_c = local_c + 1;
            }
            if (local_20.z != 1) {
              local_6bd = 1;
              local_6b8 = local_6b0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_6b0,"xyz",&local_6b9);
              local_6b8 = local_690;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_690,"xz",&local_6ba);
              local_6b8 = local_670;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_670,"xz",&local_6bb);
              local_6b8 = local_650;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_650,"xyz",&local_6bc);
              local_6bd = 0;
              local_630 = local_6b0;
              local_628 = 4;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x16fa48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                       in_stack_ffffffffffffc168);
              local_6f8 = 0xffffffff;
              local_6f4 = 0xffffffff;
              local_6f0 = 0xffffffff;
              local_6ec = 0xffffffff;
              local_6e8 = &local_6f8;
              local_6e0 = 4;
              std::allocator<int>::allocator((allocator<int> *)0x16facc);
              std::vector<int,_std::allocator<int>_>::vector
                        (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                         (allocator_type *)in_stack_ffffffffffffc168);
              Lattice::addFace(in_stack_ffffffffffffc350,
                               (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                               (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                               (vint *)in_stack_ffffffffffffc338);
              std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
              std::allocator<int>::~allocator((allocator<int> *)0x16fb3a);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffc150);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x16fb54);
              local_2af8 = (string *)&local_630;
              do {
                local_2af8 = local_2af8 + -0x20;
                std::__cxx11::string::~string(local_2af8);
              } while (local_2af8 != local_6b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_6bc);
              std::allocator<char>::~allocator((allocator<char> *)&local_6bb);
              std::allocator<char>::~allocator((allocator<char> *)&local_6ba);
              std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
              local_c = local_c + 1;
            }
          }
        }
        else if (local_20.y == *(int *)(in_RDI + 8) + -1) {
          local_7b5 = 1;
          local_7b0 = local_7a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7a8,"xz",&local_7b1);
          local_7b0 = local_788;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_788,"yz",&local_7b2);
          local_7b0 = local_768;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_768,"yz",&local_7b3);
          local_7b0 = local_748;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_748,"xz",&local_7b4);
          local_7b5 = 0;
          local_728 = local_7a8;
          local_720 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x16ff65);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_7f0 = 1;
          local_7ec = 0xffffffff;
          local_7e8 = 0xffffffff;
          local_7e4 = 1;
          local_7e0 = &local_7f0;
          local_7d8 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x16ffe9);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x170057);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x170071);
          local_2b90 = (string *)&local_728;
          do {
            local_2b90 = local_2b90 + -0x20;
            std::__cxx11::string::~string(local_2b90);
          } while (local_2b90 != local_7a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7b4);
          std::allocator<char>::~allocator((allocator<char> *)&local_7b3);
          std::allocator<char>::~allocator((allocator<char> *)&local_7b2);
          std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
          local_c = local_c + 1;
        }
        else if ((local_20.x % 2 == 0) && (local_20.y % 2 == 0)) {
          if (local_20.z != *(int *)(in_RDI + 8) + -1) {
            local_8ad = 1;
            local_8a8 = local_8a0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_8a0,"xyz",&local_8a9);
            local_8a8 = local_880;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_880,"xz",&local_8aa);
            local_8a8 = local_860;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_860,"xz",&local_8ab);
            local_8a8 = local_840;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_840,"xyz",&local_8ac);
            local_8ad = 0;
            local_820 = local_8a0;
            local_818 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1704ad);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_8e8 = 1;
            local_8e4 = 1;
            local_8e0 = 1;
            local_8dc = 1;
            local_8d8 = &local_8e8;
            local_8d0 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x170531);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x17059f);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1705b9);
            local_2c28 = (string *)&local_820;
            do {
              local_2c28 = local_2c28 + -0x20;
              std::__cxx11::string::~string(local_2c28);
            } while (local_2c28 != local_8a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_8ac);
            std::allocator<char>::~allocator((allocator<char> *)&local_8ab);
            std::allocator<char>::~allocator((allocator<char> *)&local_8aa);
            std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
            local_c = local_c + 1;
            local_9a5 = 1;
            local_9a0 = local_998;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_998,"xy",&local_9a1);
            local_9a0 = local_978;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_978,"yz",&local_9a2);
            local_9a0 = local_958;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_958,"yz",&local_9a3);
            local_9a0 = local_938;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_938,"xy",&local_9a4);
            local_9a5 = 0;
            local_918 = local_998;
            local_910 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1707da);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_9e0 = 0xffffffff;
            local_9dc = 1;
            local_9d8 = 1;
            local_9d4 = 0xffffffff;
            local_9d0 = &local_9e0;
            local_9c8 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x17085e);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x1708cc);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1708e6);
            local_2c98 = (string *)&local_918;
            do {
              local_2c98 = local_2c98 + -0x20;
              std::__cxx11::string::~string(local_2c98);
            } while (local_2c98 != local_998);
            std::allocator<char>::~allocator((allocator<char> *)&local_9a4);
            std::allocator<char>::~allocator((allocator<char> *)&local_9a3);
            std::allocator<char>::~allocator((allocator<char> *)&local_9a2);
            std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
            local_c = local_c + 1;
          }
          if (local_20.z != 1) {
            local_a9d = 1;
            local_a98 = local_a90;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a90,"xy",&local_a99);
            local_a98 = local_a70;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a70,"yz",&local_a9a);
            local_a98 = local_a50;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a50,"yz",&local_a9b);
            local_a98 = local_a30;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a30,"xy",&local_a9c);
            local_a9d = 0;
            local_a10 = local_a90;
            local_a08 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x170eab);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_ad8 = 1;
            local_ad4 = 0xffffffff;
            local_ad0 = 0xffffffff;
            local_acc = 1;
            local_ac8 = &local_ad8;
            local_ac0 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x170f2f);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x170f9d);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x170fb7);
            local_2d58 = (string *)&local_a10;
            do {
              local_2d58 = local_2d58 + -0x20;
              std::__cxx11::string::~string(local_2d58);
            } while (local_2d58 != local_a90);
            std::allocator<char>::~allocator((allocator<char> *)&local_a9c);
            std::allocator<char>::~allocator((allocator<char> *)&local_a9b);
            std::allocator<char>::~allocator((allocator<char> *)&local_a9a);
            std::allocator<char>::~allocator((allocator<char> *)&local_a99);
            local_c = local_c + 1;
            local_b95 = 1;
            local_b90 = local_b88;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b88,"xyz",&local_b91);
            local_b90 = local_b68;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b68,"xz",&local_b92);
            local_b90 = local_b48;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b48,"xz",&local_b93);
            local_b90 = local_b28;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b28,"xyz",&local_b94);
            local_b95 = 0;
            local_b08 = local_b88;
            local_b00 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1711d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_bd0 = 0xffffffff;
            local_bcc = 0xffffffff;
            local_bc8 = 0xffffffff;
            local_bc4 = 0xffffffff;
            local_bc0 = &local_bd0;
            local_bb8 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x17125c);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x1712ca);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1712e4);
            local_2dc8 = (string *)&local_b08;
            do {
              local_2dc8 = local_2dc8 + -0x20;
              std::__cxx11::string::~string(local_2dc8);
            } while (local_2dc8 != local_b88);
            std::allocator<char>::~allocator((allocator<char> *)&local_b94);
            std::allocator<char>::~allocator((allocator<char> *)&local_b93);
            std::allocator<char>::~allocator((allocator<char> *)&local_b92);
            std::allocator<char>::~allocator((allocator<char> *)&local_b91);
            local_c = local_c + 1;
          }
          local_c8d = 1;
          local_c88 = local_c80;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c80,"xyz",&local_c89);
          local_c88 = local_c60;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c60,"xy",&local_c8a);
          local_c88 = local_c40;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c40,"xy",&local_c8b);
          local_c88 = local_c20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c20,"xyz",&local_c8c);
          local_c8d = 0;
          local_c00 = local_c80;
          local_bf8 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x17189b);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_cc8 = 1;
          local_cc4 = 1;
          local_cc0 = 1;
          local_cbc = 1;
          local_cb8 = &local_cc8;
          local_cb0 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x17191f);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x17198d);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x1719a7);
          local_2e88 = (string *)&local_c00;
          do {
            local_2e88 = local_2e88 + -0x20;
            std::__cxx11::string::~string(local_2e88);
          } while (local_2e88 != local_c80);
          std::allocator<char>::~allocator((allocator<char> *)&local_c8c);
          std::allocator<char>::~allocator((allocator<char> *)&local_c8b);
          std::allocator<char>::~allocator((allocator<char> *)&local_c8a);
          std::allocator<char>::~allocator((allocator<char> *)&local_c89);
          local_c = local_c + 1;
          local_d85 = 1;
          local_d80 = local_d78;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d78,"xyz",&local_d81);
          local_d80 = local_d58;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d58,"xy",&local_d82);
          local_d80 = local_d38;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d38,"xy",&local_d83);
          local_d80 = local_d18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d18,"xyz",&local_d84);
          local_d85 = 0;
          local_cf8 = local_d78;
          local_cf0 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x171bc8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_dc0 = 0xffffffff;
          local_dbc = 0xffffffff;
          local_db8 = 0xffffffff;
          local_db4 = 0xffffffff;
          local_db0 = &local_dc0;
          local_da8 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x171c4c);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x171cba);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x171cd4);
          local_2ef8 = (string *)&local_cf8;
          do {
            local_2ef8 = local_2ef8 + -0x20;
            std::__cxx11::string::~string(local_2ef8);
          } while (local_2ef8 != local_d78);
          std::allocator<char>::~allocator((allocator<char> *)&local_d84);
          std::allocator<char>::~allocator((allocator<char> *)&local_d83);
          std::allocator<char>::~allocator((allocator<char> *)&local_d82);
          std::allocator<char>::~allocator((allocator<char> *)&local_d81);
          local_c = local_c + 1;
        }
        else if ((local_20.x % 2 == 1) && (local_20.y % 2 == 1)) {
          if (local_20.z != *(int *)(in_RDI + 8) + -1) {
            local_e7d = 1;
            local_e78 = local_e70;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e70,"xyz",&local_e79);
            local_e78 = local_e50;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e50,"xz",&local_e7a);
            local_e78 = local_e30;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e30,"xz",&local_e7b);
            local_e78 = local_e10;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e10,"xyz",&local_e7c);
            local_e7d = 0;
            local_df0 = local_e70;
            local_de8 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1722d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_eb8 = 1;
            local_eb4 = 1;
            local_eb0 = 1;
            local_eac = 1;
            local_ea8 = &local_eb8;
            local_ea0 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x17235c);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x1723ca);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1723e4);
            local_2fb8 = (string *)&local_df0;
            do {
              local_2fb8 = local_2fb8 + -0x20;
              std::__cxx11::string::~string(local_2fb8);
            } while (local_2fb8 != local_e70);
            std::allocator<char>::~allocator((allocator<char> *)&local_e7c);
            std::allocator<char>::~allocator((allocator<char> *)&local_e7b);
            std::allocator<char>::~allocator((allocator<char> *)&local_e7a);
            std::allocator<char>::~allocator((allocator<char> *)&local_e79);
            local_c = local_c + 1;
            local_f75 = 1;
            local_f70 = local_f68;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f68,"xy",&local_f71);
            local_f70 = local_f48;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f48,"yz",&local_f72);
            local_f70 = local_f28;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f28,"yz",&local_f73);
            local_f70 = local_f08;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f08,"xy",&local_f74);
            local_f75 = 0;
            local_ee8 = local_f68;
            local_ee0 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x172605);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_fb0 = 0xffffffff;
            local_fac = 1;
            local_fa8 = 1;
            local_fa4 = 0xffffffff;
            local_fa0 = &local_fb0;
            local_f98 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x172689);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x1726f7);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x172711);
            local_3028 = (string *)&local_ee8;
            do {
              local_3028 = local_3028 + -0x20;
              std::__cxx11::string::~string(local_3028);
            } while (local_3028 != local_f68);
            std::allocator<char>::~allocator((allocator<char> *)&local_f74);
            std::allocator<char>::~allocator((allocator<char> *)&local_f73);
            std::allocator<char>::~allocator((allocator<char> *)&local_f72);
            std::allocator<char>::~allocator((allocator<char> *)&local_f71);
            local_c = local_c + 1;
          }
          if (local_20.z != 1) {
            local_106d = 1;
            local_1068 = local_1060;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1060,"xy",&local_1069);
            local_1068 = local_1040;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1040,"yz",&local_106a);
            local_1068 = local_1020;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1020,"yz",&local_106b);
            local_1068 = local_1000;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1000,"xy",&local_106c);
            local_106d = 0;
            local_fe0 = local_1060;
            local_fd8 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x172cd6);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_10a8 = 1;
            local_10a4 = 0xffffffff;
            local_10a0 = 0xffffffff;
            local_109c = 1;
            local_1098 = &local_10a8;
            local_1090 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x172d5a);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x172dc8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x172de2);
            local_30e8 = (string *)&local_fe0;
            do {
              local_30e8 = local_30e8 + -0x20;
              std::__cxx11::string::~string(local_30e8);
            } while (local_30e8 != local_1060);
            std::allocator<char>::~allocator((allocator<char> *)&local_106c);
            std::allocator<char>::~allocator((allocator<char> *)&local_106b);
            std::allocator<char>::~allocator((allocator<char> *)&local_106a);
            std::allocator<char>::~allocator((allocator<char> *)&local_1069);
            local_c = local_c + 1;
            local_1165 = 1;
            local_1160 = local_1158;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1158,"xyz",&local_1161);
            local_1160 = local_1138;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1138,"xz",&local_1162);
            local_1160 = local_1118;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1118,"xz",&local_1163);
            local_1160 = local_10f8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_10f8,"xyz",&local_1164);
            local_1165 = 0;
            local_10d8 = local_1158;
            local_10d0 = 4;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x173003);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,
                     in_stack_ffffffffffffc168);
            local_11a0 = 0xffffffff;
            local_119c = 0xffffffff;
            local_1198 = 0xffffffff;
            local_1194 = 0xffffffff;
            local_1190 = &local_11a0;
            local_1188 = 4;
            std::allocator<int>::allocator((allocator<int> *)0x173087);
            std::vector<int,_std::allocator<int>_>::vector
                      (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                       (allocator_type *)in_stack_ffffffffffffc168);
            Lattice::addFace(in_stack_ffffffffffffc350,
                             (int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                             (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                             (vint *)in_stack_ffffffffffffc338);
            std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
            std::allocator<int>::~allocator((allocator<int> *)0x1730f5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc150);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x17310f);
            local_3158 = (string *)&local_10d8;
            do {
              local_3158 = local_3158 + -0x20;
              std::__cxx11::string::~string(local_3158);
            } while (local_3158 != local_1158);
            std::allocator<char>::~allocator((allocator<char> *)&local_1164);
            std::allocator<char>::~allocator((allocator<char> *)&local_1163);
            std::allocator<char>::~allocator((allocator<char> *)&local_1162);
            std::allocator<char>::~allocator((allocator<char> *)&local_1161);
            local_c = local_c + 1;
          }
          local_125d = 1;
          local_1258 = local_1250;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1250,"xz",&local_1259);
          local_1258 = local_1230;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1230,"yz",&local_125a);
          local_1258 = local_1210;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1210,"yz",&local_125b);
          local_1258 = local_11f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_11f0,"xz",&local_125c);
          local_125d = 0;
          local_11d0 = local_1250;
          local_11c8 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1736c6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_1298 = 1;
          local_1294 = 0xffffffff;
          local_1290 = 0xffffffff;
          local_128c = 1;
          local_1288 = &local_1298;
          local_1280 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x17374a);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x1737b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x1737d2);
          local_3218 = (string *)&local_11d0;
          do {
            local_3218 = local_3218 + -0x20;
            std::__cxx11::string::~string(local_3218);
          } while (local_3218 != local_1250);
          std::allocator<char>::~allocator((allocator<char> *)&local_125c);
          std::allocator<char>::~allocator((allocator<char> *)&local_125b);
          std::allocator<char>::~allocator((allocator<char> *)&local_125a);
          std::allocator<char>::~allocator((allocator<char> *)&local_1259);
          local_c = local_c + 1;
          local_1355 = 1;
          local_1350 = local_1348;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1348,"xz",&local_1351);
          local_1350 = local_1328;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1328,"yz",&local_1352);
          local_1350 = local_1308;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1308,"yz",&local_1353);
          local_1350 = local_12e8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_12e8,"xz",&local_1354);
          local_1355 = 0;
          local_12c8 = local_1348;
          local_12c0 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1739f3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_1390 = 0xffffffff;
          local_138c = 1;
          local_1388 = 1;
          local_1384 = 0xffffffff;
          local_1380 = &local_1390;
          local_1378 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x173a77);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x173ae5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x173aff);
          local_3288 = (string *)&local_12c8;
          do {
            local_3288 = local_3288 + -0x20;
            std::__cxx11::string::~string(local_3288);
          } while (local_3288 != local_1348);
          std::allocator<char>::~allocator((allocator<char> *)&local_1354);
          std::allocator<char>::~allocator((allocator<char> *)&local_1353);
          std::allocator<char>::~allocator((allocator<char> *)&local_1352);
          std::allocator<char>::~allocator((allocator<char> *)&local_1351);
          local_c = local_c + 1;
        }
      }
      else if (local_20.x == 0) {
        local_144d = 1;
        local_1448 = local_1440;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1440,"xz",&local_1449);
        local_1448 = local_1420;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1420,"yz",&local_144a);
        local_1448 = local_1400;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1400,"yz",&local_144b);
        local_1448 = local_13e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_13e0,"xz",&local_144c);
        local_144d = 0;
        local_13c0 = local_1440;
        local_13b8 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1740d3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1488 = 1;
        local_1484 = 0xffffffff;
        local_1480 = 0xffffffff;
        local_147c = 1;
        local_1478 = &local_1488;
        local_1470 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x174157);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1741c5);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1741df);
        local_3348 = (string *)&local_13c0;
        do {
          local_3348 = local_3348 + -0x20;
          std::__cxx11::string::~string(local_3348);
        } while (local_3348 != local_1440);
        std::allocator<char>::~allocator((allocator<char> *)&local_144c);
        std::allocator<char>::~allocator((allocator<char> *)&local_144b);
        std::allocator<char>::~allocator((allocator<char> *)&local_144a);
        std::allocator<char>::~allocator((allocator<char> *)&local_1449);
        local_c = local_c + 1;
      }
      else if (local_20.y == 0) {
        if (local_20.x != *(int *)(in_RDI + 8) + -1) {
          local_1545 = 1;
          local_1540 = local_1538;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1538,"xyz",&local_1541);
          local_1540 = local_1518;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1518,"xy",&local_1542);
          local_1540 = local_14f8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_14f8,"xy",&local_1543);
          local_1540 = local_14d8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_14d8,"xyz",&local_1544);
          local_1545 = 0;
          local_14b8 = local_1538;
          local_14b0 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1745fa);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_1580 = 1;
          local_157c = 1;
          local_1578 = 1;
          local_1574 = 1;
          local_1570 = &local_1580;
          local_1568 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x17467e);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x1746ec);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x174706);
          local_33e0 = (string *)&local_14b8;
          do {
            local_33e0 = local_33e0 + -0x20;
            std::__cxx11::string::~string(local_33e0);
          } while (local_33e0 != local_1538);
          std::allocator<char>::~allocator((allocator<char> *)&local_1544);
          std::allocator<char>::~allocator((allocator<char> *)&local_1543);
          std::allocator<char>::~allocator((allocator<char> *)&local_1542);
          std::allocator<char>::~allocator((allocator<char> *)&local_1541);
          local_c = local_c + 1;
          local_163d = 1;
          local_1638 = local_1630;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1630,"xyz",&local_1639);
          local_1638 = local_1610;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1610,"yz",&local_163a);
          local_1638 = local_15f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_15f0,"yz",&local_163b);
          local_1638 = local_15d0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_15d0,"xyz",&local_163c);
          local_163d = 0;
          local_15b0 = local_1630;
          local_15a8 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x174927);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_1678 = 1;
          local_1674 = 1;
          local_1670 = 1;
          local_166c = 1;
          local_1668 = &local_1678;
          local_1660 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x1749ab);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x174a19);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x174a33);
          local_3450 = (string *)&local_15b0;
          do {
            local_3450 = local_3450 + -0x20;
            std::__cxx11::string::~string(local_3450);
          } while (local_3450 != local_1630);
          std::allocator<char>::~allocator((allocator<char> *)&local_163c);
          std::allocator<char>::~allocator((allocator<char> *)&local_163b);
          std::allocator<char>::~allocator((allocator<char> *)&local_163a);
          std::allocator<char>::~allocator((allocator<char> *)&local_1639);
          local_c = local_c + 1;
          local_1735 = 1;
          local_1730 = local_1728;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1728,"xy",&local_1731);
          local_1730 = local_1708;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1708,"xz",&local_1732);
          local_1730 = local_16e8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_16e8,"xz",&local_1733);
          local_1730 = local_16c8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_16c8,"xy",&local_1734);
          local_1735 = 0;
          local_16a8 = local_1728;
          local_16a0 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x174c54);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168)
          ;
          local_1770 = 1;
          local_176c = 0xffffffff;
          local_1768 = 0xffffffff;
          local_1764 = 1;
          local_1760 = &local_1770;
          local_1758 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x174cd8);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                     (allocator_type *)in_stack_ffffffffffffc168);
          Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20)
                           ,(int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                           (vint *)in_stack_ffffffffffffc338);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
          std::allocator<int>::~allocator((allocator<int> *)0x174d46);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc150);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x174d60);
          local_34c0 = (string *)&local_16a8;
          do {
            local_34c0 = local_34c0 + -0x20;
            std::__cxx11::string::~string(local_34c0);
          } while (local_34c0 != local_1728);
          std::allocator<char>::~allocator((allocator<char> *)&local_1734);
          std::allocator<char>::~allocator((allocator<char> *)&local_1733);
          std::allocator<char>::~allocator((allocator<char> *)&local_1732);
          std::allocator<char>::~allocator((allocator<char> *)&local_1731);
          local_c = local_c + 1;
        }
      }
      else if (local_20.x == *(int *)(in_RDI + 8) + -1) {
        local_182d = 1;
        local_1828 = local_1820;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1820,"xyz",&local_1829);
        local_1828 = local_1800;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1800,"xy",&local_182a);
        local_1828 = local_17e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_17e0,"xy",&local_182b);
        local_1828 = local_17c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_17c0,"xyz",&local_182c);
        local_182d = 0;
        local_17a0 = local_1820;
        local_1798 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1754fc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1868 = 0xffffffff;
        local_1864 = 0xffffffff;
        local_1860 = 0xffffffff;
        local_185c = 0xffffffff;
        local_1858 = &local_1868;
        local_1850 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x175580);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1755ee);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x175608);
        local_35a8 = (string *)&local_17a0;
        do {
          local_35a8 = local_35a8 + -0x20;
          std::__cxx11::string::~string(local_35a8);
        } while (local_35a8 != local_1820);
        std::allocator<char>::~allocator((allocator<char> *)&local_182c);
        std::allocator<char>::~allocator((allocator<char> *)&local_182b);
        std::allocator<char>::~allocator((allocator<char> *)&local_182a);
        std::allocator<char>::~allocator((allocator<char> *)&local_1829);
        local_c = local_c + 1;
      }
      else if (local_20.y == *(int *)(in_RDI + 8) + -1) {
        local_1925 = 1;
        local_1920 = local_1918;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1918,"xz",&local_1921);
        local_1920 = local_18f8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_18f8,"yz",&local_1922);
        local_1920 = local_18d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_18d8,"yz",&local_1923);
        local_1920 = local_18b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_18b8,"xz",&local_1924);
        local_1925 = 0;
        local_1898 = local_1918;
        local_1890 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x175a14);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1960 = 1;
        local_195c = 0xffffffff;
        local_1958 = 0xffffffff;
        local_1954 = 1;
        local_1950 = &local_1960;
        local_1948 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x175a98);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x175b06);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x175b20);
        local_3640 = (string *)&local_1898;
        do {
          local_3640 = local_3640 + -0x20;
          std::__cxx11::string::~string(local_3640);
        } while (local_3640 != local_1918);
        std::allocator<char>::~allocator((allocator<char> *)&local_1924);
        std::allocator<char>::~allocator((allocator<char> *)&local_1923);
        std::allocator<char>::~allocator((allocator<char> *)&local_1922);
        std::allocator<char>::~allocator((allocator<char> *)&local_1921);
        local_c = local_c + 1;
        local_1a1d = 1;
        local_1a18 = local_1a10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a10,"xy",&local_1a19);
        local_1a18 = local_19f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_19f0,"xz",&local_1a1a);
        local_1a18 = local_19d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_19d0,"xz",&local_1a1b);
        local_1a18 = local_19b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_19b0,"xy",&local_1a1c);
        local_1a1d = 0;
        local_1990 = local_1a10;
        local_1988 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x175d41);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1a58 = 0xffffffff;
        local_1a54 = 1;
        local_1a50 = 1;
        local_1a4c = 0xffffffff;
        local_1a48 = &local_1a58;
        local_1a40 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x175dc5);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x175e33);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x175e4d);
        local_36b0 = (string *)&local_1990;
        do {
          local_36b0 = local_36b0 + -0x20;
          std::__cxx11::string::~string(local_36b0);
        } while (local_36b0 != local_1a10);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1c);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1b);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1a);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a19);
        local_c = local_c + 1;
        local_1b15 = 1;
        local_1b10 = local_1b08;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b08,"xyz",&local_1b11);
        local_1b10 = local_1ae8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ae8,"yz",&local_1b12);
        local_1b10 = local_1ac8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ac8,"yz",&local_1b13);
        local_1b10 = local_1aa8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1aa8,"xyz",&local_1b14);
        local_1b15 = 0;
        local_1a88 = local_1b08;
        local_1a80 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x17606e);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1b50 = 0xffffffff;
        local_1b4c = 0xffffffff;
        local_1b48 = 0xffffffff;
        local_1b44 = 0xffffffff;
        local_1b40 = &local_1b50;
        local_1b38 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x1760f2);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x176160);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x17617a);
        local_3720 = (string *)&local_1a88;
        do {
          local_3720 = local_3720 + -0x20;
          std::__cxx11::string::~string(local_3720);
        } while (local_3720 != local_1b08);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b14);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b13);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b12);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b11);
        local_c = local_c + 1;
      }
      else if ((local_20.x % 2 == 0) && (local_20.y % 2 == 1)) {
        local_1c0d = 1;
        local_1c08 = local_1c00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c00,"xz",&local_1c09);
        local_1c08 = local_1be0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1be0,"xy",&local_1c0a);
        local_1c08 = local_1bc0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1bc0,"xy",&local_1c0b);
        local_1c08 = local_1ba0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ba0,"xz",&local_1c0c);
        local_1c0d = 0;
        local_1b80 = local_1c00;
        local_1b78 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x176929);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1c48 = 1;
        local_1c44 = 0xffffffff;
        local_1c40 = 0xffffffff;
        local_1c3c = 1;
        local_1c38 = &local_1c48;
        local_1c30 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x1769ad);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x176a1b);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x176a35);
        local_3808 = (string *)&local_1b80;
        do {
          local_3808 = local_3808 + -0x20;
          std::__cxx11::string::~string(local_3808);
        } while (local_3808 != local_1c00);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c0c);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c0b);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c0a);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c09);
        local_c = local_c + 1;
        local_1d05 = 1;
        local_1d00 = local_1cf8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1cf8,"xyz",&local_1d01);
        local_1d00 = local_1cd8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1cd8,"yz",&local_1d02);
        local_1d00 = local_1cb8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1cb8,"yz",&local_1d03);
        local_1d00 = local_1c98;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c98,"xyz",&local_1d04);
        local_1d05 = 0;
        local_1c78 = local_1cf8;
        local_1c70 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x176c56);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1d40 = 0xffffffff;
        local_1d3c = 0xffffffff;
        local_1d38 = 0xffffffff;
        local_1d34 = 0xffffffff;
        local_1d30 = &local_1d40;
        local_1d28 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x176cda);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x176d48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x176d62);
        local_3878 = (string *)&local_1c78;
        do {
          local_3878 = local_3878 + -0x20;
          std::__cxx11::string::~string(local_3878);
        } while (local_3878 != local_1cf8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d04);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d03);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d02);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d01);
        local_c = local_c + 1;
        local_1dfd = 1;
        local_1df8 = local_1df0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1df0,"xyz",&local_1df9);
        local_1df8 = local_1dd0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1dd0,"yz",&local_1dfa);
        local_1df8 = local_1db0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1db0,"yz",&local_1dfb);
        local_1df8 = local_1d90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d90,"xyz",&local_1dfc);
        local_1dfd = 0;
        local_1d70 = local_1df0;
        local_1d68 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x176f83);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1e38 = 1;
        local_1e34 = 1;
        local_1e30 = 1;
        local_1e2c = 1;
        local_1e28 = &local_1e38;
        local_1e20 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x177007);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x177075);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x17708f);
        local_38e8 = (string *)&local_1d70;
        do {
          local_38e8 = local_38e8 + -0x20;
          std::__cxx11::string::~string(local_38e8);
        } while (local_38e8 != local_1df0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1dfc);
        std::allocator<char>::~allocator((allocator<char> *)&local_1dfb);
        std::allocator<char>::~allocator((allocator<char> *)&local_1dfa);
        std::allocator<char>::~allocator((allocator<char> *)&local_1df9);
        local_c = local_c + 1;
        local_1ef5 = 1;
        local_1ef0 = local_1ee8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ee8,"xz",&local_1ef1);
        local_1ef0 = local_1ec8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ec8,"xy",&local_1ef2);
        local_1ef0 = local_1ea8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1ea8,"xy",&local_1ef3);
        local_1ef0 = local_1e88;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e88,"xz",&local_1ef4);
        local_1ef5 = 0;
        local_1e68 = local_1ee8;
        local_1e60 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1772b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_1f30 = 0xffffffff;
        local_1f2c = 1;
        local_1f28 = 1;
        local_1f24 = 0xffffffff;
        local_1f20 = &local_1f30;
        local_1f18 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x177334);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1773a2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1773bc);
        local_3958 = (string *)&local_1e68;
        do {
          local_3958 = local_3958 + -0x20;
          std::__cxx11::string::~string(local_3958);
        } while (local_3958 != local_1ee8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ef4);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ef3);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ef2);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ef1);
        local_c = local_c + 1;
        local_1fed = 1;
        local_1fe8 = local_1fe0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1fe0,"xz",&local_1fe9);
        local_1fe8 = local_1fc0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1fc0,"yz",&local_1fea);
        local_1fe8 = local_1fa0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1fa0,"yz",&local_1feb);
        local_1fe8 = local_1f80;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f80,"xz",&local_1fec);
        local_1fed = 0;
        local_1f60 = local_1fe0;
        local_1f58 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1775dd);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_2028 = 1;
        local_2024 = 0xffffffff;
        local_2020 = 0xffffffff;
        local_201c = 1;
        local_2018 = &local_2028;
        local_2010 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x177661);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1776cf);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1776e9);
        local_39c8 = (string *)&local_1f60;
        do {
          local_39c8 = local_39c8 + -0x20;
          std::__cxx11::string::~string(local_39c8);
        } while (local_39c8 != local_1fe0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1fec);
        std::allocator<char>::~allocator((allocator<char> *)&local_1feb);
        std::allocator<char>::~allocator((allocator<char> *)&local_1fea);
        std::allocator<char>::~allocator((allocator<char> *)&local_1fe9);
        local_c = local_c + 1;
        local_20e5 = 1;
        local_20e0 = local_20d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_20d8,"xz",&local_20e1);
        local_20e0 = local_20b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_20b8,"yz",&local_20e2);
        local_20e0 = local_2098;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2098,"yz",&local_20e3);
        local_20e0 = local_2078;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2078,"xz",&local_20e4);
        local_20e5 = 0;
        local_2058 = local_20d8;
        local_2050 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x17790a);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_2120 = 0xffffffff;
        local_211c = 1;
        local_2118 = 1;
        local_2114 = 0xffffffff;
        local_2110 = &local_2120;
        local_2108 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x17798e);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1779fc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x177a16);
        local_3a38 = (string *)&local_2058;
        do {
          local_3a38 = local_3a38 + -0x20;
          std::__cxx11::string::~string(local_3a38);
        } while (local_3a38 != local_20d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_20e4);
        std::allocator<char>::~allocator((allocator<char> *)&local_20e3);
        std::allocator<char>::~allocator((allocator<char> *)&local_20e2);
        std::allocator<char>::~allocator((allocator<char> *)&local_20e1);
        local_c = local_c + 1;
      }
      else if ((local_20.x % 2 == 1) && (local_20.y % 2 == 0)) {
        local_21dd = 1;
        local_21d8 = local_21d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_21d0,"xyz",&local_21d9);
        local_21d8 = local_21b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_21b0,"yz",&local_21da);
        local_21d8 = local_2190;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2190,"yz",&local_21db);
        local_21d8 = local_2170;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2170,"xyz",&local_21dc);
        local_21dd = 0;
        local_2150 = local_21d0;
        local_2148 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x17871d);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_2218 = 1;
        local_2214 = 1;
        local_2210 = 1;
        local_220c = 1;
        local_2208 = &local_2218;
        local_2200 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x1787a1);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x17880f);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x178829);
        local_3b98 = (string *)&local_2150;
        do {
          local_3b98 = local_3b98 + -0x20;
          std::__cxx11::string::~string(local_3b98);
        } while (local_3b98 != local_21d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_21dc);
        std::allocator<char>::~allocator((allocator<char> *)&local_21db);
        std::allocator<char>::~allocator((allocator<char> *)&local_21da);
        std::allocator<char>::~allocator((allocator<char> *)&local_21d9);
        local_c = local_c + 1;
        local_22d5 = 1;
        local_22d0 = local_22c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_22c8,"xz",&local_22d1);
        local_22d0 = local_22a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_22a8,"xy",&local_22d2);
        local_22d0 = local_2288;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2288,"xy",&local_22d3);
        local_22d0 = local_2268;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2268,"xz",&local_22d4);
        local_22d5 = 0;
        local_2248 = local_22c8;
        local_2240 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x178a4a);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_2310 = 0xffffffff;
        local_230c = 1;
        local_2308 = 1;
        local_2304 = 0xffffffff;
        local_2300 = &local_2310;
        local_22f8 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x178ace);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x178b3c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x178b56);
        local_3c08 = (string *)&local_2248;
        do {
          local_3c08 = local_3c08 + -0x20;
          std::__cxx11::string::~string(local_3c08);
        } while (local_3c08 != local_22c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_22d4);
        std::allocator<char>::~allocator((allocator<char> *)&local_22d3);
        std::allocator<char>::~allocator((allocator<char> *)&local_22d2);
        std::allocator<char>::~allocator((allocator<char> *)&local_22d1);
        local_c = local_c + 1;
        local_23cd = 1;
        local_23c8 = local_23c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_23c0,"xz",&local_23c9);
        local_23c8 = local_23a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_23a0,"xy",&local_23ca);
        local_23c8 = local_2380;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2380,"xy",&local_23cb);
        local_23c8 = local_2360;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2360,"xz",&local_23cc);
        local_23cd = 0;
        local_2340 = local_23c0;
        local_2338 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x178d77);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_2408 = 1;
        local_2404 = 0xffffffff;
        local_2400 = 0xffffffff;
        local_23fc = 1;
        local_23f8 = &local_2408;
        local_23f0 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x178dfb);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x178e69);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x178e83);
        local_3c78 = (string *)&local_2340;
        do {
          local_3c78 = local_3c78 + -0x20;
          std::__cxx11::string::~string(local_3c78);
        } while (local_3c78 != local_23c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_23cc);
        std::allocator<char>::~allocator((allocator<char> *)&local_23cb);
        std::allocator<char>::~allocator((allocator<char> *)&local_23ca);
        std::allocator<char>::~allocator((allocator<char> *)&local_23c9);
        local_c = local_c + 1;
        local_24c5 = 1;
        local_24c0 = (Lattice *)local_24b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_24b8,"xyz",&local_24c1);
        in_stack_ffffffffffffc350 = (Lattice *)local_2498;
        local_24c0 = in_stack_ffffffffffffc350;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_stack_ffffffffffffc350,"yz",&local_24c2);
        in_stack_ffffffffffffc340 = (string *)(local_2498 + 0x20);
        in_stack_ffffffffffffc348 = &local_24c3;
        local_24c0 = (Lattice *)in_stack_ffffffffffffc340;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(in_stack_ffffffffffffc340,"yz",in_stack_ffffffffffffc348);
        in_stack_ffffffffffffc338 = &local_24c4;
        local_24c0 = (Lattice *)local_2458;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2458,"xyz",in_stack_ffffffffffffc338);
        local_24c5 = 0;
        local_2438 = local_24b8;
        local_2430 = (_Base_ptr)0x4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1790a4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_2500 = 0xffffffff;
        local_24fc = 0xffffffff;
        local_24f8 = 0xffffffff;
        local_24f4 = 0xffffffff;
        local_24f0 = &local_2500;
        local_24e8 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x179128);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x179196);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1791b0);
        local_3ce8 = (string *)&local_2438;
        do {
          local_3ce8 = local_3ce8 + -0x20;
          std::__cxx11::string::~string(local_3ce8);
        } while (local_3ce8 != local_24b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_24c4);
        std::allocator<char>::~allocator((allocator<char> *)&local_24c3);
        std::allocator<char>::~allocator((allocator<char> *)&local_24c2);
        std::allocator<char>::~allocator((allocator<char> *)&local_24c1);
        local_c = local_c + 1;
        local_25bd = 1;
        local_25b8 = local_25b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_25b0,"xyz",&local_25b9);
        local_25b8 = local_2590;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2590,"xy",&local_25ba);
        local_25b8 = local_2570;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2570,"xy",&local_25bb);
        local_25b8 = local_2550;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2550,"xyz",&local_25bc);
        local_25bd = 0;
        local_2530 = local_25b0;
        local_2528 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1793d1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_25f8 = 1;
        local_25f4 = 1;
        local_25f0 = 1;
        local_25ec = 1;
        local_25e8 = &local_25f8;
        local_25e0 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x179455);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1794c3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1794dd);
        local_3d58 = (string *)&local_2530;
        do {
          local_3d58 = local_3d58 + -0x20;
          std::__cxx11::string::~string(local_3d58);
        } while (local_3d58 != local_25b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_25bc);
        std::allocator<char>::~allocator((allocator<char> *)&local_25bb);
        std::allocator<char>::~allocator((allocator<char> *)&local_25ba);
        std::allocator<char>::~allocator((allocator<char> *)&local_25b9);
        local_c = local_c + 1;
        local_26b5 = 1;
        local_26b0 = local_26a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_26a8,"xyz",&local_26b1);
        local_26b0 = local_2688;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2688,"xy",&local_26b2);
        local_26b0 = local_2668;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2668,"xy",&local_26b3);
        local_26b0 = local_2648;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2648,"xyz",&local_26b4);
        local_26b5 = 0;
        local_2628 = local_26a8;
        local_2620 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1796fe);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc170,in_stack_ffffffffffffc178,in_stack_ffffffffffffc168);
        local_26f0 = 0xffffffff;
        local_26ec = 0xffffffff;
        local_26e8 = 0xffffffff;
        local_26e4 = 0xffffffff;
        local_26e0 = &local_26f0;
        local_26d8 = 4;
        std::allocator<int>::allocator((allocator<int> *)0x179782);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffc170,(initializer_list<int>)in_stack_ffffffffffffc178,
                   (allocator_type *)in_stack_ffffffffffffc168);
        Lattice::addFace(in_stack_ffffffffffffc350,(int)((ulong)in_stack_ffffffffffffc348 >> 0x20),
                         (int)in_stack_ffffffffffffc348,(vstr *)in_stack_ffffffffffffc340,
                         (vint *)in_stack_ffffffffffffc338);
        std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffc150);
        std::allocator<int>::~allocator((allocator<int> *)0x1797f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x17980a);
        local_3dc8 = (string *)&local_2628;
        do {
          local_3dc8 = local_3dc8 + -0x20;
          std::__cxx11::string::~string(local_3dc8);
        } while (local_3dc8 != local_26a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_26b4);
        std::allocator<char>::~allocator((allocator<char> *)&local_26b3);
        std::allocator<char>::~allocator((allocator<char> *)&local_26b2);
        std::allocator<char>::~allocator((allocator<char> *)&local_26b1);
        local_c = local_c + 1;
      }
    }
  }
  return;
}

Assistant:

void RhombicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
        {
            if (coordinate.z == 0)
            {
                continue;
            }
            else if (coordinate.z % 2 == 1)
            {
                if (coordinate.y == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.x == l - 1)
                {
                    if (coordinate.y == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"yz", "xz", "xz", "yz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 0)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 1)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
            }
            else
            {
                if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.y == 0)
                {
                    if (coordinate.x == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
            }
        }
    }
}